

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

VertexBuffer * __thiscall sf::VertexBuffer::operator=(VertexBuffer *this,VertexBuffer *right)

{
  VertexBuffer *in_RSI;
  VertexBuffer *in_RDI;
  VertexBuffer temp;
  VertexBuffer *in_stack_ffffffffffffffa8;
  VertexBuffer *in_stack_ffffffffffffffe8;
  
  VertexBuffer(in_RSI,in_stack_ffffffffffffffe8);
  swap(in_RDI,in_stack_ffffffffffffffa8);
  ~VertexBuffer(in_RDI);
  return in_RDI;
}

Assistant:

VertexBuffer& VertexBuffer::operator =(const VertexBuffer& right)
{
    VertexBuffer temp(right);

    swap(temp);

    return *this;
}